

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextCharFromUtf8(uint *out_char,char *in_text,char *in_text_end)

{
  byte bVar1;
  int iVar2;
  byte *in_RDX;
  byte *in_RSI;
  uint *in_RDI;
  int e;
  uchar s [4];
  int wanted;
  int len;
  uint local_38;
  uint local_34;
  uint local_30;
  int local_20;
  byte *local_18;
  
  iVar2 = (int)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
               [(int)(uint)*in_RSI >> 3];
  local_20 = iVar2 + (uint)((iVar2 != 0 ^ 0xffU) & 1);
  local_18 = in_RDX;
  if (in_RDX == (byte *)0x0) {
    local_18 = in_RSI + local_20;
  }
  if (in_RSI < local_18) {
    bVar1 = *in_RSI;
  }
  else {
    bVar1 = 0;
  }
  if (in_RSI + 1 < local_18) {
    local_30 = (uint)(char)in_RSI[1];
  }
  else {
    local_30 = 0;
  }
  if (in_RSI + 2 < local_18) {
    local_34 = (uint)(char)in_RSI[2];
  }
  else {
    local_34 = 0;
  }
  if (in_RSI + 3 < local_18) {
    local_38 = (uint)(char)in_RSI[3];
  }
  else {
    local_38 = 0;
  }
  *in_RDI = ((uint)bVar1 & ImTextCharFromUtf8::masks[iVar2]) << 0x12;
  *in_RDI = (local_30 & 0x3f) << 0xc | *in_RDI;
  *in_RDI = (local_34 & 0x3f) << 6 | *in_RDI;
  *in_RDI = local_38 & 0x3f | *in_RDI;
  *in_RDI = *in_RDI >> ((byte)ImTextCharFromUtf8::shiftc[iVar2] & 0x1f);
  if ((int)(((int)(local_38 & 0xff) >> 6 |
            (int)(local_34 & 0xc0) >> 4 |
            (int)(local_30 & 0xc0) >> 2 |
            (uint)(0xffff < *in_RDI) << 8 |
            (uint)(*in_RDI >> 0xb == 0x1b) << 7 |
            (uint)(*in_RDI < ImTextCharFromUtf8::mins[iVar2]) << 6) ^ 0x2a) >>
      ((byte)ImTextCharFromUtf8::shifte[iVar2] & 0x1f) != 0) {
    local_20 = ImMin<int>(local_20,(uint)(bVar1 != 0) + (uint)((char)local_30 != '\0') +
                                   (uint)((char)local_34 != '\0') + (uint)((char)local_38 != '\0'));
    *in_RDI = 0xfffd;
  }
  return local_20;
}

Assistant:

int ImTextCharFromUtf8(unsigned int* out_char, const char* in_text, const char* in_text_end)
{
    static const char lengths[32] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 2, 2, 2, 2, 3, 3, 4, 0 };
    static const int masks[]  = { 0x00, 0x7f, 0x1f, 0x0f, 0x07 };
    static const uint32_t mins[] = { 0x400000, 0, 0x80, 0x800, 0x10000 };
    static const int shiftc[] = { 0, 18, 12, 6, 0 };
    static const int shifte[] = { 0, 6, 4, 2, 0 };
    int len = lengths[*(const unsigned char*)in_text >> 3];
    int wanted = len + !len;

    if (in_text_end == NULL)
        in_text_end = in_text + wanted; // Max length, nulls will be taken into account.

    // Copy at most 'len' bytes, stop copying at 0 or past in_text_end. Branch predictor does a good job here,
    // so it is fast even with excessive branching.
    unsigned char s[4];
    s[0] = in_text + 0 < in_text_end ? in_text[0] : 0;
    s[1] = in_text + 1 < in_text_end ? in_text[1] : 0;
    s[2] = in_text + 2 < in_text_end ? in_text[2] : 0;
    s[3] = in_text + 3 < in_text_end ? in_text[3] : 0;

    // Assume a four-byte character and load four bytes. Unused bits are shifted out.
    *out_char  = (uint32_t)(s[0] & masks[len]) << 18;
    *out_char |= (uint32_t)(s[1] & 0x3f) << 12;
    *out_char |= (uint32_t)(s[2] & 0x3f) <<  6;
    *out_char |= (uint32_t)(s[3] & 0x3f) <<  0;
    *out_char >>= shiftc[len];

    // Accumulate the various error conditions.
    int e = 0;
    e  = (*out_char < mins[len]) << 6; // non-canonical encoding
    e |= ((*out_char >> 11) == 0x1b) << 7;  // surrogate half?
    e |= (*out_char > IM_UNICODE_CODEPOINT_MAX) << 8;  // out of range?
    e |= (s[1] & 0xc0) >> 2;
    e |= (s[2] & 0xc0) >> 4;
    e |= (s[3]       ) >> 6;
    e ^= 0x2a; // top two bits of each tail byte correct?
    e >>= shifte[len];

    if (e)
    {
        // No bytes are consumed when *in_text == 0 || in_text == in_text_end.
        // One byte is consumed in case of invalid first byte of in_text.
        // All available bytes (at most `len` bytes) are consumed on incomplete/invalid second to last bytes.
        // Invalid or incomplete input may consume less bytes than wanted, therefore every byte has to be inspected in s.
        wanted = ImMin(wanted, !!s[0] + !!s[1] + !!s[2] + !!s[3]);
        *out_char = IM_UNICODE_CODEPOINT_INVALID;
    }

    return wanted;
}